

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  PathDescriptionSyntax *pPVar1;
  Token *in_stack_00000008;
  Token *in_stack_00000010;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *in_stack_00000018;
  Token *in_stack_00000020;
  Token *in_stack_00000028;
  BumpAllocator *in_stack_00000030;
  PathSuffixSyntax *in_stack_00000050;
  Token *in_stack_00000058;
  BumpAllocator *in_stack_000000c8;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *in_stack_000000d0;
  BumpAllocator *in_stack_ffffffffffffff78;
  PathSuffixSyntax *in_stack_ffffffffffffff80;
  
  parsing::Token::deepClone((Token *)in_stack_000000d0,in_stack_000000c8);
  parsing::Token::deepClone((Token *)in_stack_000000d0,in_stack_000000c8);
  deepClone<slang::syntax::NameSyntax>(in_stack_000000d0,in_stack_000000c8);
  parsing::Token::deepClone((Token *)in_stack_000000d0,in_stack_000000c8);
  parsing::Token::deepClone((Token *)in_stack_000000d0,in_stack_000000c8);
  not_null<slang::syntax::PathSuffixSyntax_*>::operator*
            ((not_null<slang::syntax::PathSuffixSyntax_*> *)0x779990);
  deepClone<slang::syntax::PathSuffixSyntax>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  parsing::Token::deepClone((Token *)in_stack_000000d0,in_stack_000000c8);
  pPVar1 = BumpAllocator::
           emplace<slang::syntax::PathDescriptionSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::PathSuffixSyntax&,slang::parsing::Token>
                     (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018,
                      in_stack_00000010,in_stack_00000008,in_stack_00000050,in_stack_00000058);
  return (int)pPVar1;
}

Assistant:

static SyntaxNode* clone(const PathDescriptionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<PathDescriptionSyntax>(
        node.openParen.deepClone(alloc),
        node.edgeIdentifier.deepClone(alloc),
        *deepClone(node.inputs, alloc),
        node.polarityOperator.deepClone(alloc),
        node.pathOperator.deepClone(alloc),
        *deepClone<PathSuffixSyntax>(*node.suffix, alloc),
        node.closeParen.deepClone(alloc)
    );
}